

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_fillreadbuffer(Curl_easy *data,size_t bytes,size_t *nreadp)

{
  bool bVar1;
  undefined8 __src;
  int iVar2;
  curl_read_callback __dest;
  size_t sVar3;
  size_t sVar4;
  char local_8b [8];
  char hexbuffer [11];
  char *endofline_network;
  char *endofline_native;
  int hexlen;
  _Bool added_crlf;
  SingleRequest *k;
  int trailers_ret_code;
  CURLcode result;
  curl_slist *trailers;
  size_t sStack_48;
  int eof_index;
  void *extra_data;
  curl_read_callback readfunc;
  size_t nread;
  size_t buffersize;
  size_t *nreadp_local;
  size_t bytes_local;
  Curl_easy *data_local;
  
  extra_data = (void *)0x0;
  sStack_48 = 0;
  trailers._4_4_ = 0;
  nread = bytes;
  buffersize = (size_t)nreadp;
  nreadp_local = (size_t *)bytes;
  bytes_local = (size_t)data;
  if ((data->state).trailers_state == TRAILERS_INITIALIZED) {
    _trailers_ret_code = (curl_slist *)0x0;
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"Moving trailers state machine from initialized to sending.");
    }
    *(undefined4 *)(bytes_local + 0x12c8) = 2;
    Curl_dyn_init((dynbuf *)(bytes_local + 0x1220),0x10000);
    *(undefined8 *)(bytes_local + 0x1218) = 0;
    Curl_set_in_callback((Curl_easy *)bytes_local,true);
    iVar2 = (**(code **)(bytes_local + 0xa40))(&trailers_ret_code);
    Curl_set_in_callback((Curl_easy *)bytes_local,false);
    if (iVar2 == 0) {
      k._4_4_ = Curl_http_compile_trailers
                          (_trailers_ret_code,(dynbuf *)(bytes_local + 0x1220),
                           (Curl_easy *)bytes_local);
    }
    else {
      Curl_failf((Curl_easy *)bytes_local,"operation aborted by trailing headers callback");
      *(undefined8 *)buffersize = 0;
      k._4_4_ = CURLE_ABORTED_BY_CALLBACK;
    }
    if (k._4_4_ != CURLE_OK) {
      Curl_dyn_free((dynbuf *)(bytes_local + 0x1220));
      curl_slist_free_all(_trailers_ret_code);
      return k._4_4_;
    }
    if ((bytes_local != 0) && ((*(ulong *)(bytes_local + 0xa52) >> 0x1c & 1) != 0)) {
      Curl_infof((Curl_easy *)bytes_local,"Successfully compiled trailers.");
    }
    curl_slist_free_all(_trailers_ret_code);
  }
  if (((*(ushort *)(bytes_local + 0x193) >> 9 & 1) != 0) && (*(int *)(bytes_local + 0x12c8) == 0)) {
    nread = nread - 0xc;
    *(long *)(bytes_local + 0x178) = *(long *)(bytes_local + 0x178) + 10;
  }
  if (*(int *)(bytes_local + 0x12c8) == 2) {
    extra_data = trailers_read;
    sStack_48 = bytes_local;
    trailers._4_4_ = 1;
  }
  else {
    extra_data = *(void **)(bytes_local + 0x1198);
    sStack_48 = *(size_t *)(bytes_local + 0x11a0);
  }
  if (*(char *)(bytes_local + 400 + (long)trailers._4_4_) == '\0') {
    Curl_set_in_callback((Curl_easy *)bytes_local,true);
    readfunc = (curl_read_callback)
               (*(code *)extra_data)(*(undefined8 *)(bytes_local + 0x178),1,nread,sStack_48);
    Curl_set_in_callback((Curl_easy *)bytes_local,false);
    *(byte *)(bytes_local + 400 + (long)trailers._4_4_) =
         (readfunc != (curl_read_callback)0x0 ^ 0xffU) & 1;
  }
  else {
    readfunc = (curl_read_callback)0x0;
  }
  if (readfunc == (curl_read_callback)0x10000000) {
    Curl_failf((Curl_easy *)bytes_local,"operation aborted by callback");
    *(undefined8 *)buffersize = 0;
    data_local._4_4_ = CURLE_ABORTED_BY_CALLBACK;
  }
  else if (readfunc == (curl_read_callback)0x10000001) {
    if ((*(uint *)(*(long *)(*(long *)(bytes_local + 0x20) + 0x2a8) + 0x8c) & 0x10) == 0) {
      *(uint *)(bytes_local + 300) = *(uint *)(bytes_local + 300) | 0x20;
      if ((*(ushort *)(bytes_local + 0x193) >> 9 & 1) != 0) {
        *(long *)(bytes_local + 0x178) = *(long *)(bytes_local + 0x178) + -10;
      }
      *(undefined8 *)buffersize = 0;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf((Curl_easy *)bytes_local,"Read callback asked for PAUSE when not supported");
      data_local._4_4_ = CURLE_READ_ERROR;
    }
  }
  else if (nread < readfunc) {
    *(undefined8 *)buffersize = 0;
    Curl_failf((Curl_easy *)bytes_local,"read function returned funny value");
    data_local._4_4_ = CURLE_READ_ERROR;
  }
  else {
    if (((*(ushort *)(bytes_local + 0x193) >> 0xb & 1) == 0) &&
       ((*(ushort *)(bytes_local + 0x193) >> 9 & 1) != 0)) {
      bVar1 = false;
      endofline_native._0_4_ = 0;
      if (((*(uint *)(bytes_local + 0x134c) >> 0xe & 1) == 0) &&
         ((*(ulong *)(bytes_local + 0xa52) >> 4 & 1) == 0)) {
        endofline_network = "\r\n";
        hexbuffer._3_8_ = (long)" \t\r\n" + 2;
      }
      else {
        endofline_network = "\n";
        hexbuffer._3_8_ =
             (long)
             ")\n  list(APPEND _cmake_expected_targets \"${_cmake_expected_target}\")\n  if(TARGET \"${_cmake_expected_target}\")\n    list(APPEND _cmake_targets_defined \"${_cmake_expected_target}\")\n  else()\n    list(APPEND _cmake_targets_not_defined \"${_cmake_expected_target}\")\n  endif()\nendforeach()\nunset(_cmake_expected_target)\nif(_cmake_targets_defined STREQUAL _cmake_expected_targets)\n  unset(_cmake_targets_defined)\n  unset(_cmake_targets_not_defined)\n  unset(_cmake_expected_targets)\n  unset(CMAKE_IMPORT_FILE_VERSION)\n  cmake_policy(POP)\n  return()\nendif()\nif(NOT _cmake_targets_defined STREQUAL \"\")\n  string(REPLACE \";\" \", \" _cmake_targets_defined_text \"${_cmake_targets_defined}\")\n  string(REPLACE \";\" \", \" _cmake_targets_not_defined_text \"${_cmake_targets_not_defined}\")\n  message(FATAL_ERROR \"Some (but not all) targets in this export set were already defined.\\nTargets Defined: ${_cmake_targets_defined_text}\\nTargets not yet defined: ${_cmake_targets_not_defined_text}\\n\")\nendif()\nunset(_cmake_targets_defined)\nunset(_cmake_targets_not_defined)\nunset(_cmake_expected_targets)\n\n\n"
             + 0x431;
      }
      if (*(int *)(bytes_local + 0x12c8) != 2) {
        memset(local_8b,0,0xb);
        endofline_native._0_4_ = curl_msnprintf(local_8b,0xb,"%zx%s",readfunc,endofline_network);
        *(long *)(bytes_local + 0x178) =
             *(long *)(bytes_local + 0x178) - (long)(int)endofline_native;
        readfunc = readfunc + (int)endofline_native;
        memcpy(*(void **)(bytes_local + 0x178),local_8b,(long)(int)endofline_native);
        __src = hexbuffer._3_8_;
        if (((readfunc == (curl_read_callback)(long)(int)endofline_native) &&
            (*(long *)(bytes_local + 0xa40) != 0)) && (*(int *)(bytes_local + 0x12c8) == 0)) {
          *(undefined4 *)(bytes_local + 0x12c8) = 1;
        }
        else {
          __dest = readfunc + *(long *)(bytes_local + 0x178);
          sVar4 = strlen((char *)hexbuffer._3_8_);
          memcpy(__dest,(void *)__src,sVar4);
          bVar1 = true;
        }
      }
      if ((*(int *)(bytes_local + 0x12c8) == 2) &&
         (sVar3 = trailers_left((void *)bytes_local), sVar3 == 0)) {
        Curl_dyn_free((dynbuf *)(bytes_local + 0x1220));
        *(undefined4 *)(bytes_local + 0x12c8) = 3;
        *(undefined8 *)(bytes_local + 0xa38) = 0;
        *(undefined8 *)(bytes_local + 0xa40) = 0;
        *(ushort *)(bytes_local + 0x193) = *(ushort *)(bytes_local + 0x193) & 0xffef | 0x10;
        if ((bytes_local != 0) && ((*(ulong *)(bytes_local + 0xa52) >> 0x1c & 1) != 0)) {
          Curl_infof((Curl_easy *)bytes_local,"Signaling end of chunked upload after trailers.");
        }
      }
      else if (((readfunc == (curl_read_callback)(long)(int)endofline_native) &&
               ((*(int *)(bytes_local + 0x12c8) != 1 &&
                (*(ushort *)(bytes_local + 0x193) = *(ushort *)(bytes_local + 0x193) & 0xffef | 0x10
                , bytes_local != 0)))) && ((*(ulong *)(bytes_local + 0xa52) >> 0x1c & 1) != 0)) {
        Curl_infof((Curl_easy *)bytes_local,"Signaling end of chunked upload via terminating chunk."
                  );
      }
      if (bVar1) {
        sVar4 = strlen((char *)hexbuffer._3_8_);
        readfunc = readfunc + sVar4;
      }
    }
    *(curl_read_callback *)buffersize = readfunc;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct Curl_easy *data, size_t bytes,
                             size_t *nreadp)
{
  size_t buffersize = bytes;
  size_t nread;
  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;
  int eof_index = 0;

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.");
    data->state.trailers_state = TRAILERS_SENDING;
    Curl_dyn_init(&data->state.trailers_buf, DYN_TRAILERS);

    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_dyn_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.");
    curl_slist_free_all(trailers);
  }
#endif

#ifndef CURL_DISABLE_HTTP
  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = trailers_read;
    extra_data = (void *)data;
    eof_index = 1;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  if(!data->req.fread_eof[eof_index]) {
    Curl_set_in_callback(data, true);
    nread = readfunc(data->req.upload_fromhere, 1, buffersize, extra_data);
    Curl_set_in_callback(data, false);
    /* make sure the callback is not called again after EOF */
    data->req.fread_eof[eof_index] = !nread;
  }
  else
    nread = 0;

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(data->conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

#ifndef CURL_DISABLE_HTTP
  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on state.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->state.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

    if(data->state.trailers_state == TRAILERS_SENDING &&
       !trailers_left(data)) {
      Curl_dyn_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.");
    }
    else
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#endif

  *nreadp = nread;

  return CURLE_OK;
}